

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

DisasmMethod method_from_string(char *method)

{
  int iVar1;
  char *method_local;
  
  iVar1 = strcmp(method,"asm");
  if (iVar1 == 0) {
    method_local._4_4_ = Asm;
  }
  else {
    iVar1 = strcmp(method,"glsl");
    if (iVar1 == 0) {
      method_local._4_4_ = GLSL;
    }
    else {
      iVar1 = strcmp(method,"amd");
      if (iVar1 == 0) {
        method_local._4_4_ = ISA;
      }
      else {
        iVar1 = strcmp(method,"isa");
        if (iVar1 != 0) {
          fprintf(_stderr,"Fossilize ERROR: Invalid disasm method: %s\n",method);
          fflush(_stderr);
          exit(1);
        }
        method_local._4_4_ = ISA;
      }
    }
  }
  return method_local._4_4_;
}

Assistant:

static DisasmMethod method_from_string(const char *method)
{
	if (strcmp(method, "asm") == 0)
		return DisasmMethod::Asm;
	else if (strcmp(method, "glsl") == 0)
		return DisasmMethod::GLSL;
	else if (strcmp(method, "amd") == 0) // Compat
		return DisasmMethod::ISA;
	else if (strcmp(method, "isa") == 0) // Compat
		return DisasmMethod::ISA;
	else
	{
		LOGE("Invalid disasm method: %s\n", method);
		exit(EXIT_FAILURE);
	}
}